

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O0

void __thiscall ElasticSupport::addAnEquation(ElasticSupport *this,Balk *balk)

{
  double dVar1;
  bool bVar2;
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *pvVar3;
  __shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ElasticSupport *pEVar5;
  element_type *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  reference this_02;
  reference pvVar6;
  double dVar7;
  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
  local_28;
  iterator it;
  int ind_in_A;
  Balk *balk_local;
  ElasticSupport *this_local;
  
  Balk::func(balk,0,(double)(this->super_Term).shift * (this->super_Term).segment_length);
  it._M_current._4_4_ = 0;
  pvVar3 = Balk::getTerms(balk);
  local_28._M_current =
       (shared_ptr<Term> *)
       std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin(pvVar3);
  while( true ) {
    p_Var4 = &__gnu_cxx::
              __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
              ::operator->(&local_28)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
    pEVar5 = (ElasticSupport *)std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
    if (this == pEVar5) break;
    p_Var4 = &__gnu_cxx::
              __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
              ::operator->(&local_28)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
    this_00 = std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
    bVar2 = Term::isUnknown(this_00);
    if (bVar2) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
    ::operator++(&local_28);
  }
  pvVar3 = Balk::getTerms(balk);
  local_30._M_current =
       (shared_ptr<Term> *)
       std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end(pvVar3);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar2) {
    dVar1 = this->k;
    dVar7 = Balk::getEJ(balk);
    this_01 = Balk::getA(balk);
    this_02 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::back(this_01);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_02,(long)it._M_current._4_4_);
    *pvVar6 = 1.0 / (dVar1 * dVar7) + *pvVar6;
    return;
  }
  __assert_fail("it != balk.getTerms().end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/maksimkulis[P]balk_cpp/src/forces_and_moments.cpp"
                ,0x6a,"virtual void ElasticSupport::addAnEquation(Balk &) const");
}

Assistant:

void ElasticSupport::addAnEquation(Balk &balk) const
{
    balk.func(0, shift * segment_length);
    int ind_in_A = 0;
    auto it = balk.getTerms().begin();
    while (this != it->get())
    {
        if (it->get()->isUnknown())
        {
            ++ind_in_A;
        }
        ++it;
    }
    assert(it != balk.getTerms().end());
    balk.getA().back()[ind_in_A] += 1 / (k * balk.getEJ());
}